

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

urlencode * __thiscall cppcms::filters::urlencode::operator=(urlencode *this,urlencode *other)

{
  streamable *in_RSI;
  urlencode *in_RDI;
  
  streamable::operator=(in_RSI,&in_RDI->obj_);
  return in_RDI;
}

Assistant:

urlencode const &urlencode::operator=(urlencode const &other){ obj_ = other.obj_; return *this; }